

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__jpeg_test(stbi__context *s)

{
  undefined8 *__s;
  stbi__context *in_RDI;
  stbi__jpeg *j;
  int r;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  int local_4;
  
  __s = (undefined8 *)stbi__malloc(0x2d97e3);
  if (__s == (undefined8 *)0x0) {
    local_4 = stbi__err("Out of memory");
  }
  else {
    memset(__s,0,0x4888);
    *__s = in_RDI;
    stbi__setup_jpeg((stbi__jpeg *)0x2d982a);
    local_4 = stbi__decode_jpeg_header
                        ((stbi__jpeg *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8)
                         ,(int)((ulong)__s >> 0x20));
    stbi__rewind(in_RDI);
    free(__s);
  }
  return local_4;
}

Assistant:

static int stbi__jpeg_test(stbi__context *s)
{
   int r;
   stbi__jpeg* j = (stbi__jpeg*)stbi__malloc(sizeof(stbi__jpeg));
   if (!j) return stbi__err("outofmem", "Out of memory");
   memset(j, 0, sizeof(stbi__jpeg));
   j->s = s;
   stbi__setup_jpeg(j);
   r = stbi__decode_jpeg_header(j, STBI__SCAN_type);
   stbi__rewind(s);
   STBI_FREE(j);
   return r;
}